

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

Vec_Int_t * Nwk_ManLutMerge(Nwk_Man_t *pNtk,void *pParsInit)

{
  void *pvVar1;
  Nwk_Obj_t *pLut;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *__ptr;
  Nwk_Grf_t *pNVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Ptr_t *vCands;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  timespec ts;
  timespec local_98;
  Vec_Ptr_t *local_88;
  Vec_Ptr_t *local_80;
  uint local_74;
  long local_70;
  Nwk_Man_t *local_68;
  Vec_Ptr_t *local_60;
  Vec_Ptr_t *local_58;
  Nwk_Grf_t *local_50;
  Nwk_LMPars_t *local_48;
  ulong local_40;
  ulong local_38;
  
  iVar4 = clock_gettime(3,&local_98);
  if (iVar4 < 0) {
    local_70 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    local_70 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  lVar7 = (long)pNtk->vObjs->nSize;
  uVar10 = 0;
  iVar4 = 0;
  if (0 < lVar7) {
    lVar8 = 0;
    iVar4 = 0;
    do {
      pvVar1 = pNtk->vObjs->pArray[lVar8];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x20) & 7) == 3)) {
        iVar4 = iVar4 + (uint)(*(int *)((long)pvVar1 + 0x3c) <= *pParsInit);
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  local_50 = Nwk_ManGraphAlloc(iVar4);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  local_58 = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  local_60 = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  local_88 = pVVar5;
  vCands = (Vec_Ptr_t *)malloc(0x10);
  vCands->nCap = 1000;
  vCands->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  vCands->pArray = ppvVar6;
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    uVar10 = 0;
    local_80 = vCands;
    local_68 = pNtk;
    local_48 = (Nwk_LMPars_t *)pParsInit;
    do {
      pLut = (Nwk_Obj_t *)pVVar5->pArray[lVar7];
      if (((pLut != (Nwk_Obj_t *)0x0) && ((*(uint *)&pLut->field_0x20 & 7) == 3)) &&
         (pLut->nFanins <= ((Nwk_LMPars_t *)pParsInit)->nMaxLutSize)) {
        Nwk_ManCollectOverlapCands(pLut,local_88,(Nwk_LMPars_t *)pParsInit);
        if (((Nwk_LMPars_t *)pParsInit)->fUseDiffSupp != 0) {
          Nwk_ManCollectNonOverlapCands(pLut,local_58,local_60,vCands,(Nwk_LMPars_t *)pParsInit);
        }
        pNVar3 = local_50;
        uVar12 = (ulong)(uint)local_88->nSize;
        if ((uVar12 != 0) || (vCands->nSize != 0)) {
          local_40 = (ulong)(uint)vCands->nSize;
          local_74 = uVar10;
          if (0 < local_88->nSize) {
            ppvVar6 = local_88->pArray;
            uVar11 = 0;
            do {
              Nwk_ManGraphHashEdge(pNVar3,pLut->Id,*(int *)((long)ppvVar6[uVar11] + 0x24));
              uVar11 = uVar11 + 1;
            } while (uVar12 != uVar11);
          }
          uVar11 = local_40;
          iVar4 = (int)local_40;
          local_38 = uVar12;
          if (0 < iVar4) {
            ppvVar6 = local_80->pArray;
            uVar12 = 0;
            do {
              Nwk_ManGraphHashEdge(pNVar3,pLut->Id,*(int *)((long)ppvVar6[uVar12] + 0x24));
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
          }
          pParsInit = local_48;
          uVar10 = local_74 + (int)local_38 + iVar4;
          vCands = local_80;
          pNtk = local_68;
          if (local_48->fVeryVerbose != 0) {
            printf("Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
                   (ulong)(uint)pLut->Id,(ulong)(uint)pLut->nFanins,(ulong)(uint)pLut->nFanins,
                   local_38,uVar11 & 0xffffffff);
            vCands = local_80;
            pNtk = local_68;
          }
        }
      }
      lVar7 = lVar7 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar7 < pVVar5->nSize);
  }
  pVVar5 = local_58;
  if (local_58->pArray != (void **)0x0) {
    free(local_58->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  free(pVVar5);
  pNVar3 = local_50;
  __ptr = local_60;
  pVVar5 = local_88;
  if (local_60->pArray != (void **)0x0) {
    free(local_60->pArray);
    __ptr->pArray = (void **)0x0;
  }
  free(__ptr);
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  free(pVVar5);
  if (vCands->pArray != (void **)0x0) {
    free(vCands->pArray);
    vCands->pArray = (void **)0x0;
  }
  free(vCands);
  if (((Nwk_LMPars_t *)pParsInit)->fVerbose != 0) {
    iVar4 = 0x98fc59;
    printf("Mergable LUTs = %6d. Total cands = %6d. ",(ulong)(uint)pNVar3->nVertsMax,(ulong)uVar10);
    Abc_Print(iVar4,"%s =","Deriving graph");
    iVar9 = 3;
    iVar4 = clock_gettime(3,&local_98);
    if (iVar4 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar7 + local_70) / 1000000.0);
  }
  iVar4 = clock_gettime(3,&local_98);
  if (iVar4 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  Nwk_ManGraphSolve(pNVar3);
  if (((Nwk_LMPars_t *)pParsInit)->fVerbose != 0) {
    iVar4 = 0x98fc91;
    printf("GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ",(ulong)(uint)pNVar3->nVerts,
           (ulong)(uint)pNVar3->nEdges,(ulong)(uint)(pNVar3->vPairs->nSize / 2));
    Abc_Print(iVar4,"%s =","Solving");
    iVar9 = 3;
    iVar4 = clock_gettime(3,&local_98);
    if (iVar4 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    Abc_Print(iVar9,"%9.2f sec\n",(double)(lVar8 + lVar7) / 1000000.0);
    Nwk_ManGraphReportMemoryUsage(pNVar3);
  }
  pVVar2 = pNVar3->vPairs;
  pNVar3->vPairs = (Vec_Int_t *)0x0;
  Nwk_ManGraphFree(pNVar3);
  return pVVar2;
}

Assistant:

Vec_Int_t * Nwk_ManLutMerge( Nwk_Man_t * pNtk, void * pParsInit )
{
    Nwk_LMPars_t * pPars = (Nwk_LMPars_t *)pParsInit;
    Nwk_Grf_t * p;
    Vec_Int_t * vResult;
    Vec_Ptr_t * vStart, * vNext, * vCands1, * vCands2;
    Nwk_Obj_t * pLut, * pCand;
    int i, k, nVertsMax, nCands;
    abctime clk = Abc_Clock();
    // count the number of vertices
    nVertsMax = 0;
    Nwk_ManForEachNode( pNtk, pLut, i )
        nVertsMax += (int)(Nwk_ObjFaninNum(pLut) <= pPars->nMaxLutSize);
    p = Nwk_ManGraphAlloc( nVertsMax );
    // create graph
    vStart  = Vec_PtrAlloc( 1000 );
    vNext   = Vec_PtrAlloc( 1000 );
    vCands1 = Vec_PtrAlloc( 1000 );
    vCands2 = Vec_PtrAlloc( 1000 );
    nCands  = 0;
    Nwk_ManForEachNode( pNtk, pLut, i )
    {
        if ( Nwk_ObjFaninNum(pLut) > pPars->nMaxLutSize )
            continue;
        Nwk_ManCollectOverlapCands( pLut, vCands1, pPars );
        if ( pPars->fUseDiffSupp )
            Nwk_ManCollectNonOverlapCands( pLut, vStart, vNext, vCands2, pPars );
        if ( Vec_PtrSize(vCands1) == 0 && Vec_PtrSize(vCands2) == 0 )
            continue;
        nCands += Vec_PtrSize(vCands1) + Vec_PtrSize(vCands2);
        // save candidates
        Vec_PtrForEachEntry( Nwk_Obj_t *, vCands1, pCand, k )
            Nwk_ManGraphHashEdge( p, Nwk_ObjId(pLut), Nwk_ObjId(pCand) );
        Vec_PtrForEachEntry( Nwk_Obj_t *, vCands2, pCand, k )
            Nwk_ManGraphHashEdge( p, Nwk_ObjId(pLut), Nwk_ObjId(pCand) );
        // print statistics about this node
        if ( pPars->fVeryVerbose )
        printf( "Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
            Nwk_ObjId(pLut), Nwk_ObjFaninNum(pLut), Nwk_ObjFaninNum(pLut), 
            Vec_PtrSize(vCands1), Vec_PtrSize(vCands2) );
    }
    Vec_PtrFree( vStart );
    Vec_PtrFree( vNext );
    Vec_PtrFree( vCands1 );
    Vec_PtrFree( vCands2 );
    if ( pPars->fVerbose )
    {
        printf( "Mergable LUTs = %6d. Total cands = %6d. ", p->nVertsMax, nCands );
        ABC_PRT( "Deriving graph", Abc_Clock() - clk );
    }
    // solve the graph problem
    clk = Abc_Clock();
    Nwk_ManGraphSolve( p );
    if ( pPars->fVerbose )
    {
        printf( "GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ", 
            p->nVerts, p->nEdges, Vec_IntSize(p->vPairs)/2 );
        ABC_PRT( "Solving", Abc_Clock() - clk );
        Nwk_ManGraphReportMemoryUsage( p );
    }
    vResult = p->vPairs; p->vPairs = NULL;
/*
    for ( i = 0; i < vResult->nSize; i += 2 )
        printf( "(%d,%d) ", vResult->pArray[i], vResult->pArray[i+1] );
    printf( "\n" );
*/
    Nwk_ManGraphFree( p );
    return vResult;
}